

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void * arena_bin_malloc_hard(tsdn_t *tsdn,arena_t *arena,bin_t *bin,szind_t binind,uint binshard)

{
  _Bool _Var1;
  uint uVar2;
  arena_t *arena_00;
  extent_t *slab_00;
  uint in_ECX;
  long in_RDX;
  undefined4 in_R8D;
  void *ret;
  extent_t *slab;
  bin_info_t *bin_info;
  bin_t *in_stack_ffffffffffffffb8;
  arena_t *in_stack_ffffffffffffffc0;
  bin_t *in_stack_ffffffffffffffc8;
  arena_t *arena_01;
  void *local_8;
  
  arena_01 = (arena_t *)(bin_infos + in_ECX);
  _Var1 = arena_is_auto((arena_t *)0x11494f);
  if ((!_Var1) && (*(long *)(in_RDX + 0x70) != 0)) {
    arena_bin_slabs_full_insert
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(extent_t *)0x114977);
    *(undefined8 *)(in_RDX + 0x70) = 0;
  }
  arena_00 = (arena_t *)
             arena_bin_nonfull_slab_get
                       ((tsdn_t *)CONCAT44(in_ECX,in_R8D),arena_01,in_stack_ffffffffffffffc8,
                        (szind_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                        (uint)in_stack_ffffffffffffffc0);
  if (*(long *)(in_RDX + 0x70) != 0) {
    uVar2 = extent_nfree_get(*(extent_t **)(in_RDX + 0x70));
    if (uVar2 != 0) {
      slab_00 = (extent_t *)arena_slab_reg_alloc((extent_t *)arena_01,(bin_info_t *)arena_00);
      if (arena_00 == (arena_t *)0x0) {
        return slab_00;
      }
      uVar2 = extent_nfree_get((extent_t *)arena_00);
      if (uVar2 == *(uint *)&arena_01->last_thd) {
        arena_dalloc_bin_slab((tsdn_t *)arena_01,arena_00,slab_00,in_stack_ffffffffffffffb8);
        return slab_00;
      }
      arena_bin_lower_slab((tsdn_t *)arena_01,arena_00,slab_00,in_stack_ffffffffffffffb8);
      return slab_00;
    }
    arena_bin_slabs_full_insert
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(extent_t *)0x114a57);
    *(undefined8 *)(in_RDX + 0x70) = 0;
  }
  if (arena_00 == (arena_t *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    *(arena_t **)(in_RDX + 0x70) = arena_00;
    local_8 = arena_slab_reg_alloc((extent_t *)arena_01,(bin_info_t *)arena_00);
  }
  return local_8;
}

Assistant:

static void *
arena_bin_malloc_hard(tsdn_t *tsdn, arena_t *arena, bin_t *bin,
    szind_t binind, unsigned binshard) {
	const bin_info_t *bin_info;
	extent_t *slab;

	bin_info = &bin_infos[binind];
	if (!arena_is_auto(arena) && bin->slabcur != NULL) {
		arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		bin->slabcur = NULL;
	}
	slab = arena_bin_nonfull_slab_get(tsdn, arena, bin, binind, binshard);
	if (bin->slabcur != NULL) {
		/*
		 * Another thread updated slabcur while this one ran without the
		 * bin lock in arena_bin_nonfull_slab_get().
		 */
		if (extent_nfree_get(bin->slabcur) > 0) {
			void *ret = arena_slab_reg_alloc(bin->slabcur,
			    bin_info);
			if (slab != NULL) {
				/*
				 * arena_slab_alloc() may have allocated slab,
				 * or it may have been pulled from
				 * slabs_nonfull.  Therefore it is unsafe to
				 * make any assumptions about how slab has
				 * previously been used, and
				 * arena_bin_lower_slab() must be called, as if
				 * a region were just deallocated from the slab.
				 */
				if (extent_nfree_get(slab) == bin_info->nregs) {
					arena_dalloc_bin_slab(tsdn, arena, slab,
					    bin);
				} else {
					arena_bin_lower_slab(tsdn, arena, slab,
					    bin);
				}
			}
			return ret;
		}

		arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		bin->slabcur = NULL;
	}

	if (slab == NULL) {
		return NULL;
	}
	bin->slabcur = slab;

	assert(extent_nfree_get(bin->slabcur) > 0);

	return arena_slab_reg_alloc(slab, bin_info);
}